

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

int IDASolveF(void *ida_mem,sunrealtype tout,sunrealtype *tret,N_Vector yret,N_Vector ypret,
             int itask,int *ncheckPtr)

{
  sunrealtype sVar1;
  double dVar2;
  sunrealtype *psVar3;
  undefined8 *puVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  sunrealtype sVar8;
  sunrealtype sVar9;
  sunrealtype sVar10;
  sunrealtype sVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  IDAckpntMem pIVar15;
  long lVar16;
  undefined8 *puVar17;
  double *pdVar18;
  long lVar19;
  char *msgfmt;
  int iVar20;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar20 = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar14 = -0x14;
    iVar12 = 0x181;
    goto LAB_0011a364;
  }
  if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar20 = -0x65;
    iVar14 = -0x65;
    iVar12 = 0x18c;
    goto LAB_0011a364;
  }
  if (yret == (N_Vector)0x0) {
    msgfmt = "yret = NULL illegal.";
    iVar20 = -0x16;
    iVar14 = -0x16;
    iVar12 = 0x196;
    goto LAB_0011a364;
  }
  if (ypret == (N_Vector)0x0) {
    msgfmt = "ypret = NULL illegal.";
    iVar20 = -0x16;
    iVar14 = -0x16;
    iVar12 = 0x19f;
    goto LAB_0011a364;
  }
  if (tret == (sunrealtype *)0x0) {
    msgfmt = "tret = NULL illegal.";
    iVar20 = -0x16;
    iVar14 = -0x16;
    iVar12 = 0x1a7;
    goto LAB_0011a364;
  }
  if (itask - 3U < 0xfffffffe) {
    msgfmt = "itask has an illegal value.";
    iVar20 = -0x16;
    iVar14 = -0x16;
    iVar12 = 0x1b0;
    goto LAB_0011a364;
  }
  psVar3 = *(sunrealtype **)((long)ida_mem + 0x840);
  if (*(int *)((long)ida_mem + 0x4a8) != 0) {
    *(undefined4 *)((long)psVar3 + 0x14) = 1;
    psVar3[3] = *(sunrealtype *)((long)ida_mem + 0x4b0);
  }
  puVar4 = (undefined8 *)psVar3[0xf];
  if (*(int *)(psVar3 + 2) != 0) {
    sVar1 = *(sunrealtype *)((long)ida_mem + 0x4f8);
    *psVar3 = sVar1;
    pIVar15 = (IDAckpntMem)malloc(600);
    if (pIVar15 != (IDAckpntMem)0x0) {
      pIVar15->ck_t0 = sVar1;
      uVar13 = 0;
      pIVar15->ck_nst = 0;
      pIVar15->ck_kk = 1;
      pIVar15->ck_hh = 0.0;
      if (*(int *)((long)ida_mem + 0x60) != 0) {
        uVar13 = (uint)(*(int *)((long)ida_mem + 0x78) != 0);
      }
      pIVar15->ck_quadr = uVar13;
      iVar12 = *(int *)((long)ida_mem + 0x9c);
      pIVar15->ck_sensi = iVar12;
      if (iVar12 != 0) {
        pIVar15->ck_Ns = *(int *)((long)ida_mem + 0xa0);
      }
      if (*(int *)((long)ida_mem + 0x110) == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (uint)(*(int *)((long)ida_mem + 300) != 0);
      }
      pIVar15->ck_quadr_sensi = uVar13;
      pIVar15->ck_phi_alloc = 3;
      iVar12 = IDAAckpntAllocVectors((IDAMem)ida_mem,pIVar15);
      if (iVar12 != 0) {
        IDAAckpntCopyVectors((IDAMem)ida_mem,pIVar15);
        pIVar15->ck_next = (IDAckpntMemRec *)0x0;
        psVar3[10] = (sunrealtype)pIVar15;
        if (*(int *)(psVar3 + 0x16) == 0) {
          if (*(int *)((long)ida_mem + 0x9c) == 0) {
            *(undefined4 *)(psVar3 + 0x17) = 0;
          }
          iVar12 = (*(code *)psVar3[0x14])(ida_mem);
          if (iVar12 == 0) {
            msgfmt = "A memory request failed.";
            iVar20 = -0x15;
            iVar14 = -0x15;
            iVar12 = 0x1dd;
            goto LAB_0011a364;
          }
          lVar16 = 0;
          do {
            psVar3[lVar16 + 0x19] = *(sunrealtype *)((long)ida_mem + lVar16 * 8 + 0x158);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          if (*(int *)(psVar3 + 0x17) != 0) {
            lVar16 = 0;
            do {
              psVar3[lVar16 + 0x1f] = *(sunrealtype *)((long)ida_mem + lVar16 * 8 + 0x350);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
          }
          *(undefined4 *)(psVar3 + 0x16) = 1;
          pIVar15 = (IDAckpntMem)psVar3[10];
        }
        *(sunrealtype *)*puVar4 = pIVar15->ck_t0;
        (*(code *)psVar3[0x12])(ida_mem);
        *(undefined4 *)(psVar3 + 2) = 0;
        goto LAB_00119fe1;
      }
      free(pIVar15);
    }
    psVar3[10] = 0.0;
    msgfmt = "A memory request failed.";
    iVar20 = -0x15;
    iVar14 = -0x15;
    iVar12 = 0x1ce;
LAB_0011a364:
    IDAProcessError((IDAMem)ida_mem,iVar14,iVar12,"IDASolveF",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,msgfmt);
    return iVar20;
  }
  if (itask == 1) {
    pdVar18 = psVar3 + 5;
    if (*(int *)(psVar3 + 4) == 0) {
      pdVar18 = (double *)((long)ida_mem + 0x4f8);
    }
    if (0.0 <= (*pdVar18 - tout) * *(double *)((long)ida_mem + 0x4e0)) {
      *tret = tout;
      iVar12 = IDAGetSolution(ida_mem,tout,yret,ypret);
      goto LAB_0011a448;
    }
    if (*(int *)(psVar3 + 4) != 0) {
      sVar1 = psVar3[5];
      *tret = sVar1;
      IDAGetSolution(ida_mem,sVar1,yret,ypret);
      *(undefined4 *)(psVar3 + 4) = 0;
      iVar12 = 2;
      goto LAB_0011a448;
    }
  }
LAB_00119fe1:
  lVar16 = 0;
  do {
    if (*(long *)((long)ida_mem + 0x568) <= lVar16 && 0 < *(long *)((long)ida_mem + 0x568)) {
      iVar12 = -1;
      IDAProcessError((IDAMem)ida_mem,-1,0x22a,"IDASolveF",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"At t = %.15g, mxstep steps taken before reaching tout.",
                      *(undefined8 *)((long)ida_mem + 0x4f8));
      break;
    }
    iVar12 = IDASolve(ida_mem,tout,tret,yret,ypret,2);
    if (iVar12 < 0) break;
    lVar5 = *(long *)((long)ida_mem + 0x5b8);
    lVar19 = lVar5 % (long)psVar3[0xd];
    sVar1 = *(sunrealtype *)((long)ida_mem + 0x4f8);
    if (lVar19 == 0) {
      *(sunrealtype *)((long)psVar3[10] + 8) = sVar1;
      pIVar15 = (IDAckpntMem)malloc(600);
      if (pIVar15 != (IDAckpntMem)0x0) {
        pIVar15->ck_nst = lVar5;
        pIVar15->ck_tretlast = *(sunrealtype *)((long)ida_mem + 0x500);
        iVar14 = *(int *)((long)ida_mem + 0x4b8);
        iVar20 = *(int *)((long)ida_mem + 0x4bc);
        iVar6 = *(int *)((long)ida_mem + 0x4c0);
        iVar7 = *(int *)((long)ida_mem + 0x4c4);
        pIVar15->ck_kk = iVar14;
        pIVar15->ck_kused = iVar20;
        pIVar15->ck_knew = iVar6;
        pIVar15->ck_phase = iVar7;
        pIVar15->ck_ns = *(int *)((long)ida_mem + 0x4c8);
        sVar8 = *(sunrealtype *)((long)ida_mem + 0x4e8);
        pIVar15->ck_hh = *(sunrealtype *)((long)ida_mem + 0x4e0);
        pIVar15->ck_hused = sVar8;
        pIVar15->ck_eta = *(sunrealtype *)((long)ida_mem + 0x4f0);
        sVar8 = *(sunrealtype *)((long)ida_mem + 0x510);
        pIVar15->ck_cj = *(sunrealtype *)((long)ida_mem + 0x508);
        pIVar15->ck_cjlast = sVar8;
        sVar8 = *(sunrealtype *)((long)ida_mem + 0x520);
        pIVar15->ck_cjold = *(sunrealtype *)((long)ida_mem + 0x518);
        pIVar15->ck_cjratio = sVar8;
        pIVar15->ck_ss = *(sunrealtype *)((long)ida_mem + 0x528);
        pIVar15->ck_ssS = *(sunrealtype *)((long)ida_mem + 0x550);
        pIVar15->ck_t0 = sVar1;
        sVar1 = *(sunrealtype *)((long)ida_mem + 0x188);
        sVar8 = *(sunrealtype *)((long)ida_mem + 400);
        sVar9 = *(sunrealtype *)((long)ida_mem + 0x198);
        sVar10 = *(sunrealtype *)((long)ida_mem + 0x1a0);
        sVar11 = *(sunrealtype *)((long)ida_mem + 0x1b0);
        pIVar15->ck_psi[4] = *(sunrealtype *)((long)ida_mem + 0x1a8);
        pIVar15->ck_psi[5] = sVar11;
        pIVar15->ck_psi[2] = sVar9;
        pIVar15->ck_psi[3] = sVar10;
        pIVar15->ck_psi[0] = sVar1;
        pIVar15->ck_psi[1] = sVar8;
        sVar1 = *(sunrealtype *)((long)ida_mem + 0x1b8);
        sVar8 = *(sunrealtype *)((long)ida_mem + 0x1c0);
        sVar9 = *(sunrealtype *)((long)ida_mem + 0x1c8);
        sVar10 = *(sunrealtype *)((long)ida_mem + 0x1d0);
        sVar11 = *(sunrealtype *)((long)ida_mem + 0x1e0);
        pIVar15->ck_alpha[4] = *(sunrealtype *)((long)ida_mem + 0x1d8);
        pIVar15->ck_alpha[5] = sVar11;
        pIVar15->ck_alpha[2] = sVar9;
        pIVar15->ck_alpha[3] = sVar10;
        pIVar15->ck_alpha[0] = sVar1;
        pIVar15->ck_alpha[1] = sVar8;
        sVar1 = *(sunrealtype *)((long)ida_mem + 0x1e8);
        sVar8 = *(sunrealtype *)((long)ida_mem + 0x1f0);
        sVar9 = *(sunrealtype *)((long)ida_mem + 0x1f8);
        sVar10 = *(sunrealtype *)((long)ida_mem + 0x200);
        sVar11 = *(sunrealtype *)((long)ida_mem + 0x210);
        pIVar15->ck_beta[4] = *(sunrealtype *)((long)ida_mem + 0x208);
        pIVar15->ck_beta[5] = sVar11;
        pIVar15->ck_beta[2] = sVar9;
        pIVar15->ck_beta[3] = sVar10;
        pIVar15->ck_beta[0] = sVar1;
        pIVar15->ck_beta[1] = sVar8;
        sVar1 = *(sunrealtype *)((long)ida_mem + 0x218);
        sVar8 = *(sunrealtype *)((long)ida_mem + 0x220);
        sVar9 = *(sunrealtype *)((long)ida_mem + 0x228);
        sVar10 = *(sunrealtype *)((long)ida_mem + 0x230);
        sVar11 = *(sunrealtype *)((long)ida_mem + 0x240);
        pIVar15->ck_sigma[4] = *(sunrealtype *)((long)ida_mem + 0x238);
        pIVar15->ck_sigma[5] = sVar11;
        pIVar15->ck_sigma[2] = sVar9;
        pIVar15->ck_sigma[3] = sVar10;
        pIVar15->ck_sigma[0] = sVar1;
        pIVar15->ck_sigma[1] = sVar8;
        sVar1 = *(sunrealtype *)((long)ida_mem + 0x250);
        sVar8 = *(sunrealtype *)((long)ida_mem + 600);
        sVar9 = *(sunrealtype *)((long)ida_mem + 0x260);
        sVar10 = *(sunrealtype *)((long)ida_mem + 0x268);
        sVar11 = *(sunrealtype *)((long)ida_mem + 0x270);
        pIVar15->ck_gamma[0] = *(sunrealtype *)((long)ida_mem + 0x248);
        pIVar15->ck_gamma[1] = sVar1;
        pIVar15->ck_gamma[2] = sVar8;
        pIVar15->ck_gamma[3] = sVar9;
        pIVar15->ck_gamma[4] = sVar10;
        pIVar15->ck_gamma[5] = sVar11;
        if (*(int *)((long)ida_mem + 0x60) == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = (uint)(*(int *)((long)ida_mem + 0x78) != 0);
        }
        pIVar15->ck_quadr = uVar13;
        iVar20 = *(int *)((long)ida_mem + 0x9c);
        pIVar15->ck_sensi = iVar20;
        if (iVar20 != 0) {
          pIVar15->ck_Ns = *(int *)((long)ida_mem + 0xa0);
        }
        if (*(int *)((long)ida_mem + 0x110) == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = (uint)(*(int *)((long)ida_mem + 300) != 0);
        }
        pIVar15->ck_quadr_sensi = uVar13;
        iVar20 = iVar14 + 2;
        if (3 < iVar14) {
          iVar20 = 6;
        }
        pIVar15->ck_phi_alloc = iVar20;
        iVar14 = IDAAckpntAllocVectors((IDAMem)ida_mem,pIVar15);
        if (iVar14 != 0) {
          IDAAckpntCopyVectors((IDAMem)ida_mem,pIVar15);
          pIVar15->ck_next = (IDAckpntMemRec *)psVar3[10];
          psVar3[10] = (sunrealtype)pIVar15;
          *(int *)(psVar3 + 0xc) = *(int *)(psVar3 + 0xc) + 1;
          *(undefined4 *)((long)ida_mem + 0x770) = 1;
          sVar1 = pIVar15->ck_t0;
          puVar17 = puVar4;
          goto LAB_0011a2b8;
        }
        free(pIVar15);
      }
      iVar12 = -0x15;
      break;
    }
    puVar17 = puVar4 + lVar19;
LAB_0011a2b8:
    *(sunrealtype *)*puVar17 = sVar1;
    (*(code *)psVar3[0x12])(ida_mem);
    sVar1 = *(sunrealtype *)((long)ida_mem + 0x4f8);
    *(sunrealtype *)((long)psVar3[10] + 8) = sVar1;
    psVar3[1] = sVar1;
    if (itask == 2) break;
    dVar2 = *tret;
    if (0.0 <= (dVar2 - tout) * *(double *)((long)ida_mem + 0x4e0)) {
      if (iVar12 == 2) {
        *(undefined4 *)(psVar3 + 4) = 1;
        psVar3[5] = dVar2;
      }
      *tret = tout;
      iVar12 = IDAGetSolution(ida_mem,tout,yret,ypret);
      *(sunrealtype *)((long)ida_mem + 0x500) = tout;
      break;
    }
    lVar16 = lVar16 + 1;
  } while (1 < iVar12 - 1U);
LAB_0011a448:
  *ncheckPtr = *(int *)(psVar3 + 0xc);
  *(undefined4 *)((long)psVar3 + 0xb4) = 1;
  psVar3[0xb] = psVar3[10];
  psVar3[0x10] = (sunrealtype)(*(long *)((long)ida_mem + 0x5b8) % (long)psVar3[0xd] + 1);
  return iVar12;
}

Assistant:

int IDASolveF(void* ida_mem, sunrealtype tout, sunrealtype* tret, N_Vector yret,
              N_Vector ypret, int itask, int* ncheckPtr)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDAckpntMem tmp;
  IDAdtpntMem* dt_mem;
  long int nstloc;
  int flag, i;
  sunbooleantype allocOK, earlyret;
  sunrealtype ttest;

  /* Is the mem OK? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check for yret != NULL */
  if (yret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check for ypret != NULL */
  if (ypret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YPRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  /* Check for tret != NULL */
  if (tret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_TRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check for valid itask */
  if ((itask != IDA_NORMAL) && (itask != IDA_ONE_STEP))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ITASK);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* All memory checks done, proceed ... */

  dt_mem = IDAADJ_mem->dt_mem;

  /* If tstop is enabled, store some info */
  if (IDA_mem->ida_tstopset)
  {
    IDAADJ_mem->ia_tstopIDAFcall = SUNTRUE;
    IDAADJ_mem->ia_tstopIDAF     = IDA_mem->ida_tstop;
  }

  /* On the first step:
   *   - set tinitial
   *   - initialize list of check points
   *   - if needed, initialize the interpolation module
   *   - load dt_mem[0]
   * On subsequent steps, test if taking a new step is necessary.
   */
  if (IDAADJ_mem->ia_firstIDAFcall)
  {
    IDAADJ_mem->ia_tinitial = IDA_mem->ida_tn;
    IDAADJ_mem->ck_mem      = IDAAckpntInit(IDA_mem);
    if (IDAADJ_mem->ck_mem == NULL)
    {
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_MEM_FAIL);
    }

    if (!IDAADJ_mem->ia_mallocDone)
    {
      /* Do we need to store sensitivities? */
      if (!IDA_mem->ida_sensi) { IDAADJ_mem->ia_storeSensi = SUNFALSE; }

      /* Allocate space for interpolation data */
      allocOK = IDAADJ_mem->ia_malloc(IDA_mem);
      if (!allocOK)
      {
        IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
        return (IDA_MEM_FAIL);
      }

      /* Rename phi and, if needed, phiS for use in interpolation */
      for (i = 0; i < MXORDP1; i++)
      {
        IDAADJ_mem->ia_Y[i] = IDA_mem->ida_phi[i];
      }
      if (IDAADJ_mem->ia_storeSensi)
      {
        for (i = 0; i < MXORDP1; i++)
        {
          IDAADJ_mem->ia_YS[i] = IDA_mem->ida_phiS[i];
        }
      }

      IDAADJ_mem->ia_mallocDone = SUNTRUE;
    }

    dt_mem[0]->t = IDAADJ_mem->ck_mem->ck_t0;
    IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);

    IDAADJ_mem->ia_firstIDAFcall = SUNFALSE;
  }
  else if (itask == IDA_NORMAL)
  {
    /* When in normal mode, check if tout was passed or if a previous root was
       not reported and return an interpolated solution. No changes to ck_mem
       or dt_mem are needed. */

    /* flag to signal if an early return is needed */
    earlyret = SUNFALSE;

    /* if a root needs to be reported compare tout to troot otherwise compare
       to the current time tn */
    ttest = (IDAADJ_mem->ia_rootret) ? IDAADJ_mem->ia_troot : IDA_mem->ida_tn;

    if ((ttest - tout) * IDA_mem->ida_hh >= ZERO)
    {
      /* ttest is after tout, interpolate to tout */
      *tret    = tout;
      flag     = IDAGetSolution(IDA_mem, tout, yret, ypret);
      earlyret = SUNTRUE;
    }
    else if (IDAADJ_mem->ia_rootret)
    {
      /* tout is after troot, interpolate to troot */
      *tret = IDAADJ_mem->ia_troot;
      flag  = IDAGetSolution(IDA_mem, IDAADJ_mem->ia_troot, yret, ypret);
      flag  = IDA_ROOT_RETURN;
      IDAADJ_mem->ia_rootret = SUNFALSE;
      earlyret               = SUNTRUE;
    }

    /* return if necessary */
    if (earlyret)
    {
      *ncheckPtr               = IDAADJ_mem->ia_nckpnts;
      IDAADJ_mem->ia_newData   = SUNTRUE;
      IDAADJ_mem->ia_ckpntData = IDAADJ_mem->ck_mem;
      IDAADJ_mem->ia_np        = IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps + 1;
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (flag);
    }
  }

  /* Integrate to tout (in IDA_ONE_STEP mode) while loading check points */
  nstloc = 0;
  for (;;)
  {
    /* Check for too many steps */

    if ((IDA_mem->ida_mxstep > 0) && (nstloc >= IDA_mem->ida_mxstep))
    {
      IDAProcessError(IDA_mem, IDA_TOO_MUCH_WORK, __LINE__, __func__, __FILE__,
                      MSG_MAX_STEPS, IDA_mem->ida_tn);
      flag = IDA_TOO_MUCH_WORK;
      break;
    }

    /* Perform one step of the integration */

    flag = IDASolve(IDA_mem, tout, tret, yret, ypret, IDA_ONE_STEP);
    if (flag < 0) { break; }

    nstloc++;

    /* Test if a new check point is needed */

    if (IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps == 0)
    {
      IDAADJ_mem->ck_mem->ck_t1 = IDA_mem->ida_tn;

      /* Create a new check point, load it, and append it to the list */
      tmp = IDAAckpntNew(IDA_mem);
      if (tmp == NULL)
      {
        flag = IDA_MEM_FAIL;
        break;
      }

      tmp->ck_next       = IDAADJ_mem->ck_mem;
      IDAADJ_mem->ck_mem = tmp;
      IDAADJ_mem->ia_nckpnts++;

      IDA_mem->ida_forceSetup = SUNTRUE;

      /* Reset i=0 and load dt_mem[0] */
      dt_mem[0]->t = IDAADJ_mem->ck_mem->ck_t0;
      IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);
    }
    else
    {
      /* Load next point in dt_mem */
      dt_mem[IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps]->t = IDA_mem->ida_tn;
      IDAADJ_mem->ia_storePnt(IDA_mem,
                              dt_mem[IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps]);
    }

    /* Set t1 field of the current check point structure
       for the case in which there will be no future
       check points */
    IDAADJ_mem->ck_mem->ck_t1 = IDA_mem->ida_tn;

    /* tfinal is now set to tn */
    IDAADJ_mem->ia_tfinal = IDA_mem->ida_tn;

    /* Return if in IDA_ONE_STEP mode */
    if (itask == IDA_ONE_STEP) { break; }

    /* IDA_NORMAL_STEP returns */

    /* Return if tout reached */
    if ((*tret - tout) * IDA_mem->ida_hh >= ZERO)
    {
      /* If this was a root return, save the root time to return later */
      if (flag == IDA_ROOT_RETURN)
      {
        IDAADJ_mem->ia_rootret = SUNTRUE;
        IDAADJ_mem->ia_troot   = *tret;
      }

      /* Get solution value at tout to return now */
      *tret = tout;
      flag  = IDAGetSolution(IDA_mem, tout, yret, ypret);

      /* Reset tretlast in IDA_mem so that IDAGetQuad and IDAGetSens
       * evaluate quadratures and/or sensitivities at the proper time */
      IDA_mem->ida_tretlast = tout;

      break;
    }

    /* Return if tstop or a root was found */
    if ((flag == IDA_TSTOP_RETURN) || (flag == IDA_ROOT_RETURN)) { break; }

  } /* end of for(;;) */

  /* Get ncheck from IDAADJ_mem */
  *ncheckPtr = IDAADJ_mem->ia_nckpnts;

  /* Data is available for the last interval */
  IDAADJ_mem->ia_newData   = SUNTRUE;
  IDAADJ_mem->ia_ckpntData = IDAADJ_mem->ck_mem;
  IDAADJ_mem->ia_np        = IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps + 1;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (flag);
}